

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

ConstIterator * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::ConstIterator::operator++
          (ConstIterator *__return_storage_ptr__,ConstIterator *this,int param_1)

{
  int iVar1;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *pSVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  undefined4 uVar6;
  int iVar7;
  undefined4 uVar8;
  
  iVar1 = this->m_index;
  pSVar2 = this->m_matrix;
  iVar7 = this->m_index;
  uVar8 = *(undefined4 *)&this->field_0xc;
  sVar3 = (this->m_currentTriplet).row;
  sVar4 = (this->m_currentTriplet).column;
  iVar5 = this->m_nonZerosInOuterDirection;
  uVar6 = *(undefined4 *)&this->field_0x2c;
  (__return_storage_ptr__->m_currentTriplet).value = (this->m_currentTriplet).value;
  __return_storage_ptr__->m_nonZerosInOuterDirection = iVar5;
  *(undefined4 *)&__return_storage_ptr__->field_0x2c = uVar6;
  (__return_storage_ptr__->m_currentTriplet).row = sVar3;
  (__return_storage_ptr__->m_currentTriplet).column = sVar4;
  __return_storage_ptr__->m_matrix = pSVar2;
  __return_storage_ptr__->m_index = iVar7;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = uVar8;
  if (-1 < iVar1) {
    operator++(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

typename SparseMatrix<ordering>::ConstIterator SparseMatrix<ordering>::ConstIterator::operator++(int)
    {
        if (m_index < 0) {
            //Iterator is not valid. We do nothing
            return *this;
        }
        ConstIterator newIterator(*this);
        ++newIterator;
        return newIterator;
    }